

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

int __thiscall CCEXP::CCEXPMat<int>::NewRow(CCEXPMat<int> *this,int empty)

{
  char *pcVar1;
  char *local_90;
  char *local_88;
  undefined1 local_68 [8];
  MVECTOR<int> dl;
  size_t N;
  int empty_local;
  CCEXPMat<int> *this_local;
  
  if ((this->IgnoreM & 1U) == 0) {
    dl.sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<ns_MVECTOR::MVECTOR<int>,_std::allocator<ns_MVECTOR::MVECTOR<int>_>_>::size
                   (&this->data);
    if (dl.sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->_maxRows) {
      this->newRowFlag = true;
      if (empty == 1) {
        ns_MVECTOR::MVECTOR<int>::MVECTOR((MVECTOR<int> *)local_68);
        ns_MVECTOR::MVECTOR<int>::clear((MVECTOR<int> *)local_68);
        std::vector<ns_MVECTOR::MVECTOR<int>,_std::allocator<ns_MVECTOR::MVECTOR<int>_>_>::push_back
                  (&this->data,(value_type *)local_68);
        ns_MVECTOR::MVECTOR<int>::~MVECTOR((MVECTOR<int> *)local_68);
      }
      this_local._4_4_ = 0;
    }
    else {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x2f);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x5c);
        if (pcVar1 == (char *)0x0) {
          local_90 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
          ;
        }
        else {
          local_90 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x5c);
          local_90 = local_90 + 1;
        }
        local_88 = local_90;
      }
      else {
        local_88 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x2f);
        local_88 = local_88 + 1;
      }
      CECS::RecError((CECS *)CCEXPECS,-9999,1,local_88,0x161,
                     "CCEXPMat::NewRow():: Maximum Rows (=%zu) already Reached!",this->_maxRows);
      this_local._4_4_ = -9999;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CCEXPMat<T>::NewRow(int empty) {
	if (IgnoreM) return 0;
	const size_t N = data.size();
	CECS_ERRI(CCEXPECS,N >= _maxRows,"CCEXPMat::NewRow():: Maximum Rows (=" __ZU__ ") already Reached!", _maxRows);

	newRowFlag=true;
	if (empty == 1) {
		MVECTOR<T> dl; dl.clear(); data.push_back(dl);
	}
	return 0;
}